

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_node * mg_node_alloc(uint32_t label_count,mg_allocator *allocator)

{
  mg_node *node;
  char *block;
  size_t labels_size;
  size_t in_stack_ffffffffffffffc8;
  mg_allocator *in_stack_ffffffffffffffd0;
  mg_node *local_8;
  
  local_8 = (mg_node *)mg_allocator_malloc(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (local_8 == (mg_node *)0x0) {
    local_8 = (mg_node *)0x0;
  }
  else {
    local_8->labels = (mg_string **)(local_8 + 1);
  }
  return local_8;
}

Assistant:

mg_node *mg_node_alloc(uint32_t label_count, mg_allocator *allocator) {
  size_t labels_size = label_count * sizeof(mg_string *);
  char *block = mg_allocator_malloc(allocator, sizeof(mg_node) + labels_size);
  if (!block) {
    return NULL;
  }
  mg_node *node = (mg_node *)block;
  node->labels = (mg_string **)(block + sizeof(mg_node));
  return node;
}